

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_io.cpp
# Opt level: O1

bool __thiscall ON_BrepLoopArray::Read(ON_BrepLoopArray *this,ON_BinaryArchive *file)

{
  bool bVar1;
  int iVar2;
  ON_BrepLoop *pOVar3;
  byte bVar4;
  int iVar5;
  int count;
  int major_version;
  int minor_version;
  ON__UINT32 tcode;
  ON__INT64 length_TCODE_ANONYMOUS_CHUNK;
  ON__INT32 local_38;
  int local_34 [3];
  ON__INT64 local_28;
  
  ON_ClassArray<ON_BrepLoop>::Empty((ON_ClassArray<ON_BrepLoop> *)this);
  local_34[2] = 0;
  local_28 = 0;
  local_38 = 0;
  local_34[0] = 0;
  local_34[1] = 0;
  bVar1 = ON_BinaryArchive::BeginRead3dmBigChunk(file,(uint *)(local_34 + 2),&local_28);
  if (bVar1) {
    bVar4 = bVar1 && local_34[2] == 0x40008000;
    if (bVar1 && local_34[2] == 0x40008000) {
      bVar4 = ON_BinaryArchive::Read3dmChunkVersion(file,local_34,local_34 + 1);
    }
    if ((bool)bVar4 != false) {
      if (local_34[0] == 1) {
        bVar4 = ON_BinaryArchive::ReadInt(file,&local_38);
        ON_ClassArray<ON_BrepLoop>::SetCapacity((ON_ClassArray<ON_BrepLoop> *)this,(long)local_38);
        if (((bool)bVar4) && (0 < local_38)) {
          iVar5 = 1;
          do {
            pOVar3 = ON_ClassArray<ON_BrepLoop>::AppendNew((ON_ClassArray<ON_BrepLoop> *)this);
            iVar2 = (*(pOVar3->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0xb])(pOVar3,file)
            ;
            bVar4 = (byte)iVar2;
            if (bVar4 == 0) break;
            bVar1 = iVar5 < local_38;
            iVar5 = iVar5 + 1;
          } while (bVar1);
        }
      }
      else {
        bVar4 = 0;
      }
    }
    bVar1 = ON_BinaryArchive::EndRead3dmChunk(file);
    bVar1 = (bool)(bVar1 & bVar4);
  }
  return bVar1;
}

Assistant:

bool ON_BrepLoopArray::Read( ON_BinaryArchive& file )
{
  Empty();
  ON__UINT32 tcode = 0;
  ON__INT64 length_TCODE_ANONYMOUS_CHUNK = 0;
  int count = 0;
  int i;
  int major_version = 0;
  int minor_version = 0;
  bool rc = file.BeginRead3dmBigChunk( &tcode, &length_TCODE_ANONYMOUS_CHUNK );
  if (rc) {
    if (tcode != TCODE_ANONYMOUS_CHUNK)
      rc = false;
    if (rc) rc = file.Read3dmChunkVersion(&major_version,&minor_version);
    if (rc) {
      if ( major_version==1 ) {
        if (rc) rc = file.ReadInt(&count);
        SetCapacity(count);
        for ( i = 0; i < count && rc ; i++ ) {
          ON_BrepLoop& loop = AppendNew();
          rc = loop.Read(file) ? true : false;
        }    
      }
      else {
        rc = 0;
      }
    }
    if ( !file.EndRead3dmChunk() )
      rc = false;
  }
  return rc;
}